

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O2

REF_STATUS ref_phys_wall_distance(REF_GRID ref_grid,REF_DICT ref_dict,REF_DBL *distance)

{
  REF_INT RVar1;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  uint max_ncell;
  int iVar2;
  uint uVar3;
  REF_INT *send_size;
  ulong uVar4;
  REF_INT *recv_size;
  void *__ptr;
  void *pvVar5;
  REF_DBL *pRVar6;
  undefined4 *__ptr_00;
  REF_INT *permutation;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  REF_DBL *position;
  undefined8 uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  REF_DBL *distance_00;
  char *pcVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  REF_STATUS RVar19;
  REF_DBL **in_stack_fffffffffffffee0;
  REF_INT part_complete;
  REF_INT ncell;
  REF_DBL *local_d0;
  ulong local_c8;
  REF_DBL *local_c0;
  REF_SEARCH ref_search;
  REF_INT *local_b0;
  ulong local_a8;
  REF_DBL *local_a0;
  void *local_98;
  void *local_90;
  int local_84;
  REF_INT local_node_per;
  REF_INT local_ncell;
  REF_DBL *local_78;
  REF_GRID local_70;
  REF_DBL *xyz;
  ulong local_60;
  REF_DBL radius;
  REF_DBL *local_xyz;
  REF_DBL center [3];
  
  ref_mpi = ref_grid->mpi;
  max_ncell = (ref_grid->twod == 0) + 2;
  uVar3 = ref_mpi->n;
  uVar18 = (ulong)(int)uVar3;
  if ((long)uVar18 < 0) {
    pcVar15 = "malloc a_size of REF_INT negative";
    uVar10 = 0x6dc;
LAB_001b3eb7:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar10,
           "ref_phys_wall_distance",pcVar15);
LAB_001b3ebe:
    RVar19 = 1;
  }
  else {
    ref_node = ref_grid->node;
    local_70 = ref_grid;
    send_size = (REF_INT *)malloc(uVar18 * 4);
    if (send_size == (REF_INT *)0x0) {
      pcVar15 = "malloc a_size of REF_INT NULL";
      uVar10 = 0x6dc;
    }
    else {
      for (uVar4 = 0; uVar4 < uVar18; uVar4 = uVar4 + 1) {
        send_size[uVar4] = 0;
      }
      recv_size = (REF_INT *)malloc(uVar18 * 4);
      if (recv_size == (REF_INT *)0x0) {
        pcVar15 = "malloc b_size of REF_INT NULL";
        uVar10 = 0x6dd;
      }
      else {
        for (uVar4 = 0; uVar4 < uVar18; uVar4 = uVar4 + 1) {
          recv_size[uVar4] = 0;
        }
        uVar17 = ref_node->max;
        uVar18 = 0;
        uVar4 = 0;
        if (0 < (int)uVar17) {
          uVar4 = (ulong)uVar17;
        }
        uVar7 = 0;
        for (; uVar4 != uVar18; uVar18 = uVar18 + 1) {
          if (-1 < ref_node->global[uVar18]) {
            uVar7 = uVar7 + (ref_node->ref_mpi->id == ref_node->part[uVar18]);
          }
        }
        lVar16 = 0;
        uVar18 = 0x7fffffff / (ulong)uVar3;
        if ((int)uVar7 < (int)uVar18) {
          uVar18 = (ulong)uVar7;
        }
        iVar8 = (int)uVar18;
        iVar2 = iVar8 + -1;
        iVar12 = 0;
        uVar7 = 0;
        for (; lVar16 < (int)uVar17; lVar16 = lVar16 + 1) {
          if (((-1 < ref_node->global[lVar16]) && (ref_node->ref_mpi->id == ref_node->part[lVar16]))
             && (iVar12 < iVar8)) {
            iVar14 = (int)(iVar8 + uVar3 + -1) / (int)uVar3;
            iVar13 = iVar12 / iVar14;
            iVar11 = iVar8 - (iVar2 / (int)uVar3) * uVar3;
            if (iVar11 <= iVar13) {
              iVar13 = (iVar12 - iVar14 * iVar11) / (iVar2 / (int)uVar3) + iVar11;
            }
            if (ref_mpi->id == iVar13) {
              uVar7 = uVar7 + 1;
            }
            else {
              send_size[iVar13] = send_size[iVar13] + 1;
            }
            iVar12 = iVar12 + 1;
          }
        }
        local_c0 = distance;
        if ((int)uVar7 < 0) {
          pcVar15 = "malloc stationary of REF_INT negative";
          uVar10 = 0x6f8;
          goto LAB_001b3eb7;
        }
        local_c8 = uVar18;
        __ptr = malloc((ulong)uVar7 * 4);
        if (__ptr == (void *)0x0) {
          pcVar15 = "malloc stationary of REF_INT NULL";
          uVar10 = 0x6f8;
        }
        else {
          for (uVar18 = 0; uVar7 != uVar18; uVar18 = uVar18 + 1) {
            *(undefined4 *)((long)__ptr + uVar18 * 4) = 0xffffffff;
          }
          uVar3 = ref_mpi_alltoall(ref_mpi,send_size,recv_size,1);
          if (uVar3 != 0) {
            uVar18 = (ulong)uVar3;
            pcVar15 = "alltoall sizes";
            uVar10 = 0x6fb;
LAB_001b4083:
            uVar3 = (uint)uVar18;
LAB_001b4086:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   uVar10,"ref_phys_wall_distance",uVar18,pcVar15);
            return uVar3;
          }
          uVar3 = ref_mpi->n;
          uVar18 = 0;
          uVar4 = 0;
          if (0 < (int)uVar3) {
            uVar4 = (ulong)uVar3;
          }
          uVar17 = 0;
          for (; uVar4 != uVar18; uVar18 = uVar18 + 1) {
            uVar17 = uVar17 + send_size[uVar18];
          }
          if ((int)uVar17 < 0) {
            pcVar15 = "malloc a_xyz of REF_DBL negative";
            uVar10 = 0x6ff;
            goto LAB_001b3eb7;
          }
          pvVar5 = malloc((ulong)(uVar17 * 3) << 3);
          if (pvVar5 == (void *)0x0) {
            pcVar15 = "malloc a_xyz of REF_DBL NULL";
            uVar10 = 0x6ff;
          }
          else {
            local_90 = pvVar5;
            pvVar5 = malloc((ulong)uVar17 << 3);
            if (pvVar5 == (void *)0x0) {
              pcVar15 = "malloc a_dist of REF_DBL NULL";
              uVar10 = 0x700;
            }
            else {
              uVar9 = 0;
              for (uVar18 = 0; iVar8 = (int)uVar9, uVar4 != uVar18; uVar18 = uVar18 + 1) {
                uVar9 = (ulong)(uint)(iVar8 + recv_size[uVar18]);
              }
              if (iVar8 < 0) {
                pcVar15 = "malloc b_xyz of REF_DBL negative";
                uVar10 = 0x704;
                goto LAB_001b3eb7;
              }
              local_98 = pvVar5;
              pRVar6 = (REF_DBL *)malloc((ulong)(uint)(iVar8 * 3) << 3);
              if (pRVar6 == (REF_DBL *)0x0) {
                pcVar15 = "malloc b_xyz of REF_DBL NULL";
                uVar10 = 0x704;
              }
              else {
                local_a8 = uVar9;
                local_a0 = pRVar6;
                pRVar6 = (REF_DBL *)malloc(uVar9 * 8);
                if (pRVar6 == (REF_DBL *)0x0) {
                  pcVar15 = "malloc b_dist of REF_DBL NULL";
                  uVar10 = 0x705;
                }
                else {
                  if ((int)uVar3 < 0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                           ,0x707,"ref_phys_wall_distance","malloc a_next of REF_INT negative");
                    return 1;
                  }
                  local_d0 = pRVar6;
                  __ptr_00 = (undefined4 *)malloc((ulong)uVar3 * 4);
                  if (__ptr_00 != (undefined4 *)0x0) {
                    *__ptr_00 = 0;
                    iVar8 = 0;
                    for (uVar18 = 1; uVar18 < uVar3; uVar18 = uVar18 + 1) {
                      iVar8 = iVar8 + send_size[uVar18 - 1];
                      __ptr_00[uVar18] = iVar8;
                    }
                    uVar4 = 0;
                    uVar18 = (ulong)(uint)ref_node->max;
                    if (ref_node->max < 1) {
                      uVar18 = uVar4;
                    }
                    iVar8 = 0;
                    uVar17 = 0;
                    for (uVar9 = 0; uVar9 != uVar18; uVar9 = uVar9 + 1) {
                      if (((-1 < ref_node->global[uVar9]) &&
                          (ref_node->ref_mpi->id == ref_node->part[uVar9])) &&
                         (iVar8 < (int)local_c8)) {
                        iVar13 = (int)(iVar2 + uVar3) / (int)uVar3;
                        iVar11 = iVar8 / iVar13;
                        iVar12 = (int)local_c8 - (iVar2 / (int)uVar3) * uVar3;
                        if (iVar12 <= iVar11) {
                          iVar11 = (iVar8 - iVar13 * iVar12) / (iVar2 / (int)uVar3) + iVar12;
                        }
                        if (ref_mpi->id == iVar11) {
                          *(int *)((long)__ptr + (long)(int)uVar17 * 4) = (int)uVar9;
                          uVar17 = uVar17 + 1;
                        }
                        else {
                          iVar12 = __ptr_00[iVar11];
                          pRVar6 = ref_node->real;
                          for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
                            *(undefined8 *)((long)local_90 + lVar16 * 8 + (long)(iVar12 * 3) * 8) =
                                 *(undefined8 *)((long)pRVar6 + lVar16 * 8 + uVar4);
                          }
                          __ptr_00[iVar11] = iVar12 + 1;
                        }
                        iVar8 = iVar8 + 1;
                      }
                      uVar4 = uVar4 + 0x78;
                    }
                    uVar3 = ref_mpi_alltoallv(ref_mpi,local_90,send_size,local_a0,recv_size,3,3);
                    if (uVar3 != 0) {
                      pcVar15 = "alltoallv xyz";
                      uVar10 = 0x723;
LAB_001b454d:
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                             ,uVar10,"ref_phys_wall_distance",(ulong)uVar3,pcVar15);
                      return uVar3;
                    }
                    for (uVar18 = 0; local_a8 != uVar18; uVar18 = uVar18 + 1) {
                      local_d0[uVar18] = 1e+200;
                    }
                    uVar4 = 0;
                    uVar18 = (ulong)(uint)ref_node->max;
                    if (ref_node->max < 1) {
                      uVar18 = uVar4;
                    }
                    for (; uVar18 != uVar4; uVar4 = uVar4 + 1) {
                      if (-1 < ref_node->global[uVar4]) {
                        local_c0[uVar4] = 1e+200;
                      }
                    }
                    uVar3 = ref_phys_local_wall(local_70,ref_dict,&local_node_per,&local_ncell,
                                                &local_xyz);
                    if (uVar3 != 0) {
                      pcVar15 = "local wall";
                      uVar10 = 0x72c;
                      goto LAB_001b454d;
                    }
                    if (max_ncell == local_node_per) {
                      if ((long)ref_mpi->n < 0) {
                        pcVar15 = "malloc part_ncell of REF_INT negative";
                        uVar10 = 0x72f;
                        goto LAB_001b3eb7;
                      }
                      local_b0 = (REF_INT *)malloc((long)ref_mpi->n << 2);
                      if (local_b0 != (REF_INT *)0x0) {
                        uVar3 = ref_mpi_allgather(ref_mpi,&local_ncell,local_b0,1);
                        if (uVar3 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                 ,0x731,"ref_phys_wall_distance",(ulong)uVar3,"allgather part ncell"
                                );
                          return uVar3;
                        }
                        part_complete = 0;
                        local_78 = local_xyz;
                        if ((int)uVar17 < 1) {
                          uVar17 = 0;
                        }
                        local_60 = (ulong)uVar17;
                        local_84 = max_ncell * 3;
                        local_a8 = local_a8 + 1;
                        while (part_complete < ref_mpi->n) {
                          xyz = (REF_DBL *)0x0;
                          ncell = 0;
                          uVar3 = ref_phys_bcast_parts
                                            (ref_mpi,&part_complete,local_b0,max_ncell,
                                             (REF_INT)local_78,(REF_DBL *)&ncell,(REF_INT *)&xyz,
                                             in_stack_fffffffffffffee0);
                          RVar1 = ncell;
                          if (uVar3 != 0) {
                            uVar18 = (ulong)uVar3;
                            pcVar15 = "bcast part";
                            uVar10 = 0x73b;
                            goto LAB_001b4083;
                          }
                          uVar18 = (ulong)(uint)ncell;
                          uVar3 = ref_search_create(&ref_search,ncell);
                          if (uVar3 != 0) {
                            uVar18 = (ulong)uVar3;
                            pcVar15 = "make search";
                            uVar10 = 0x73d;
                            goto LAB_001b4083;
                          }
                          if (RVar1 < 0) {
                            pcVar15 = "malloc permutation of REF_INT negative";
                            uVar10 = 0x73e;
                            goto LAB_001b3eb7;
                          }
                          permutation = (REF_INT *)malloc(uVar18 * 4);
                          if (permutation == (REF_INT *)0x0) {
                            pcVar15 = "malloc permutation of REF_INT NULL";
                            uVar10 = 0x73e;
                            goto LAB_001b40d6;
                          }
                          uVar3 = ref_sort_shuffle(RVar1,permutation);
                          pRVar6 = xyz;
                          if (uVar3 != 0) {
                            uVar18 = (ulong)uVar3;
                            pcVar15 = "shuffle";
                            uVar10 = 0x740;
                            goto LAB_001b4083;
                          }
                          uVar4 = 0;
                          while (uVar18 != uVar4) {
                            RVar1 = permutation[uVar4];
                            uVar3 = ref_node_bounding_sphere_xyz
                                              (pRVar6 + local_84 * RVar1,max_ncell,center,&radius);
                            if (uVar3 != 0) {
                              uVar18 = (ulong)uVar3;
                              pcVar15 = "bound";
                              uVar10 = 0x745;
                              goto LAB_001b4086;
                            }
                            uVar3 = ref_search_insert(ref_search,RVar1,center,radius * 1.00000001);
                            uVar4 = uVar4 + 1;
                            if (uVar3 != 0) {
                              uVar18 = (ulong)uVar3;
                              pcVar15 = "ins";
                              uVar10 = 0x746;
                              goto LAB_001b4083;
                            }
                          }
                          free(permutation);
                          position = local_a0;
                          distance_00 = local_d0;
                          uVar18 = local_a8;
                          while (uVar18 = uVar18 - 1, uVar18 != 0) {
                            uVar3 = ref_search_nearest_element
                                              (ref_search,max_ncell,pRVar6,position,distance_00);
                            position = position + 3;
                            distance_00 = distance_00 + 1;
                            if (uVar3 != 0) {
                              uVar18 = (ulong)uVar3;
                              pcVar15 = "balanced candidates";
                              uVar10 = 0x74d;
                              goto LAB_001b4083;
                            }
                          }
                          uVar18 = 0;
                          while (local_60 != uVar18) {
                            lVar16 = (long)*(int *)((long)__ptr + uVar18 * 4);
                            uVar3 = ref_search_nearest_element
                                              (ref_search,max_ncell,pRVar6,
                                               local_70->node->real + lVar16 * 0xf,local_c0 + lVar16
                                              );
                            uVar18 = uVar18 + 1;
                            if (uVar3 != 0) {
                              uVar18 = (ulong)uVar3;
                              pcVar15 = "stationary candidates";
                              uVar10 = 0x755;
                              goto LAB_001b4083;
                            }
                          }
                          uVar3 = ref_search_free(ref_search);
                          if (uVar3 != 0) {
                            uVar18 = (ulong)uVar3;
                            pcVar15 = "free";
                            uVar10 = 0x757;
                            goto LAB_001b4083;
                          }
                          free(pRVar6);
                        }
                        free(local_b0);
                        free(local_78);
                        uVar3 = ref_mpi_alltoallv(ref_mpi,local_d0,recv_size,local_98,send_size,1,3)
                        ;
                        if (uVar3 == 0) {
                          *__ptr_00 = 0;
                          iVar8 = ref_mpi->n;
                          iVar12 = 0;
                          for (lVar16 = 1; lVar16 < iVar8; lVar16 = lVar16 + 1) {
                            iVar12 = iVar12 + send_size[lVar16 + -1];
                            __ptr_00[lVar16] = iVar12;
                          }
                          uVar4 = 0;
                          uVar18 = (ulong)(uint)ref_node->max;
                          if (ref_node->max < 1) {
                            uVar18 = uVar4;
                          }
                          iVar12 = 0;
                          for (; uVar18 != uVar4; uVar4 = uVar4 + 1) {
                            if (((-1 < ref_node->global[uVar4]) &&
                                (ref_node->ref_mpi->id == ref_node->part[uVar4])) &&
                               (iVar12 < (int)local_c8)) {
                              iVar14 = (iVar2 + iVar8) / iVar8;
                              iVar13 = iVar12 / iVar14;
                              iVar11 = (int)local_c8 - (iVar2 / iVar8) * iVar8;
                              if (iVar11 <= iVar13) {
                                iVar13 = (iVar12 - iVar14 * iVar11) / (iVar2 / iVar8) + iVar11;
                              }
                              if (ref_mpi->id != iVar13) {
                                iVar11 = __ptr_00[iVar13];
                                local_c0[uVar4] = *(REF_DBL *)((long)local_98 + (long)iVar11 * 8);
                                __ptr_00[iVar13] = iVar11 + 1;
                              }
                              iVar12 = iVar12 + 1;
                            }
                          }
                          uVar3 = ref_node_ghost_dbl(ref_node,local_c0,1);
                          if (uVar3 == 0) {
                            free(local_d0);
                            free(local_a0);
                            free(local_98);
                            free(local_90);
                            free(__ptr_00);
                            free(__ptr);
                            free(recv_size);
                            free(send_size);
                            return 0;
                          }
                          uVar18 = (ulong)uVar3;
                          pcVar15 = "ghost distance";
                          uVar10 = 0x776;
                        }
                        else {
                          uVar18 = (ulong)uVar3;
                          pcVar15 = "alltoallv dist";
                          uVar10 = 0x761;
                        }
                        goto LAB_001b4083;
                      }
                      pcVar15 = "malloc part_ncell of REF_INT NULL";
                      uVar10 = 0x72f;
                      goto LAB_001b40d6;
                    }
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                           ,0x72d,"ref_phys_wall_distance","node_per miss match",(ulong)max_ncell,
                           (long)local_node_per);
                    goto LAB_001b3ebe;
                  }
                  pcVar15 = "malloc a_next of REF_INT NULL";
                  uVar10 = 0x707;
                }
              }
            }
          }
        }
      }
    }
LAB_001b40d6:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar10,
           "ref_phys_wall_distance",pcVar15);
    RVar19 = 2;
  }
  return RVar19;
}

Assistant:

REF_FCN REF_STATUS ref_phys_wall_distance(REF_GRID ref_grid, REF_DICT ref_dict,
                                          REF_DBL *distance) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT nowned, nbalance, nstationary, *stationary;
  REF_INT ncell, local_ncell, *part_ncell, part_complete, max_ncell;
  REF_INT nnode, part;
  REF_INT a_total, b_total;
  REF_INT *a_size, *b_size;
  REF_INT *a_next;
  REF_DBL *a_xyz, *b_xyz;
  REF_DBL *a_dist, *b_dist;
  REF_DBL *local_xyz, *xyz;
  REF_INT local_node_per, node_per;
  REF_INT node, cell;
  REF_INT *permutation, i;
  REF_SEARCH ref_search;
  REF_DBL center[3], radius;
  REF_DBL scale = 1.0 + 1.0e-8;

  if (ref_grid_twod(ref_grid)) {
    node_per = 2;
  } else {
    node_per = 3;
  }

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  nowned = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      nowned++;
    }
  }
  /* limit the nodes that are balanced to prevent all2all overload */
  nbalance = MIN(nowned, REF_INT_MAX / ref_mpi_n(ref_mpi));

  /* count the balanced nodes based on destination, count stationary */
  nnode = 0;
  nstationary = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      if (nnode < nbalance) {
        part = ref_part_implicit(nbalance, ref_mpi_n(ref_mpi), nnode);
        if (ref_mpi_rank(ref_mpi) == part) {
          nstationary++;
        } else {
          a_size[part]++;
        }
        nnode++;
      }
    }
  }
  ref_malloc_init(stationary, nstationary, REF_INT, REF_EMPTY);

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) { a_total += a_size[part]; }
  ref_malloc(a_xyz, 3 * a_total, REF_DBL);
  ref_malloc(a_dist, a_total, REF_DBL);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) { b_total += b_size[part]; }
  ref_malloc(b_xyz, 3 * b_total, REF_DBL);
  ref_malloc(b_dist, b_total, REF_DBL);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    a_next[part] = a_next[part - 1] + a_size[part - 1];
  }

  /* fill the balanced nodes based on destination, fill stationary */
  nnode = 0;
  nstationary = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      if (nnode < nbalance) {
        part = ref_part_implicit(nbalance, ref_mpi_n(ref_mpi), nnode);
        if (ref_mpi_rank(ref_mpi) == part) {
          stationary[nstationary] = node;
          nstationary++;
        } else {
          for (i = 0; i < 3; i++) {
            a_xyz[i + 3 * a_next[part]] = ref_node_xyz(ref_node, i, node);
          }
          a_next[part]++;
        }
        nnode++;
      }
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_xyz, a_size, b_xyz, b_size, 3, REF_DBL_TYPE),
      "alltoallv xyz");

  for (node = 0; node < b_total; node++) {
    b_dist[node] = REF_DBL_MAX;
  }
  each_ref_node_valid_node(ref_node, node) { distance[node] = REF_DBL_MAX; }

  RSS(ref_phys_local_wall(ref_grid, ref_dict, &local_node_per, &local_ncell,
                          &local_xyz),
      "local wall");
  REIS(node_per, local_node_per, "node_per miss match");

  ref_malloc(part_ncell, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &local_ncell, part_ncell, REF_INT_TYPE),
      "allgather part ncell");

  max_ncell = 1000000; /* (8 * 3 * node_per) bytes per element */

  part_complete = 0;
  while (part_complete < ref_mpi_n(ref_mpi)) {
    xyz = NULL;
    ncell = 0;
    RSS(ref_phys_bcast_parts(ref_mpi, &part_complete, part_ncell, max_ncell,
                             node_per, local_xyz, &ncell, &xyz),
        "bcast part");

    RSS(ref_search_create(&ref_search, ncell), "make search");
    ref_malloc(permutation, ncell, REF_INT);
    /* permutation randomizes tree insertion to improve balance/reduce depth */
    RSS(ref_sort_shuffle(ncell, permutation), "shuffle");
    for (i = 0; i < ncell; i++) {
      cell = permutation[i];
      RSS(ref_node_bounding_sphere_xyz(&(xyz[3 * node_per * cell]), node_per,
                                       center, &radius),
          "bound");
      RSS(ref_search_insert(ref_search, cell, center, scale * radius), "ins");
    }
    ref_free(permutation);

    for (i = 0; i < b_total; i++) {
      RSS(ref_search_nearest_element(ref_search, node_per, xyz, &(b_xyz[3 * i]),
                                     &(b_dist[i])),
          "balanced candidates");
    }
    for (i = 0; i < nstationary; i++) {
      node = stationary[i];
      RSS(ref_search_nearest_element(
              ref_search, node_per, xyz,
              ref_node_xyz_ptr(ref_grid_node(ref_grid), node),
              &(distance[node])),
          "stationary candidates");
    }
    RSS(ref_search_free(ref_search), "free");

    ref_free(xyz);
  }

  ref_free(part_ncell);
  ref_free(local_xyz);

  RSS(ref_mpi_alltoallv(ref_mpi, b_dist, b_size, a_dist, a_size, 1,
                        REF_DBL_TYPE),
      "alltoallv dist");

  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    a_next[part] = a_next[part - 1] + a_size[part - 1];
  }
  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      if (nnode < nbalance) {
        part = ref_part_implicit(nbalance, ref_mpi_n(ref_mpi), nnode);
        if (ref_mpi_rank(ref_mpi) == part) {
        } else {
          distance[node] = a_dist[a_next[part]];
          a_next[part]++;
        }
        nnode++;
      }
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, distance, 1), "ghost distance");

  ref_free(b_dist);
  ref_free(b_xyz);
  ref_free(a_dist);
  ref_free(a_xyz);
  ref_free(a_next);
  ref_free(stationary);
  ref_free(b_size);
  ref_free(a_size);
  return REF_SUCCESS;
}